

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# express_node.cpp
# Opt level: O0

bool __thiscall front::express::ExpressNode::isBinaryOperation(ExpressNode *this)

{
  bool local_9;
  ExpressNode *this_local;
  
  local_9 = true;
  if (((((this->_operation != PLUS) && (local_9 = true, this->_operation != MINU)) &&
       (local_9 = true, this->_operation != MUL)) &&
      ((((local_9 = true, this->_operation != DIV && (local_9 = true, this->_operation != MOD)) &&
        ((local_9 = true, this->_operation != OR &&
         ((local_9 = true, this->_operation != AND && (local_9 = true, this->_operation != EQL))))))
       && (local_9 = true, this->_operation != NEQ)))) &&
     (((local_9 = true, this->_operation != LSS && (local_9 = true, this->_operation != LEQ)) &&
      (local_9 = true, this->_operation != GEQ)))) {
    local_9 = this->_operation == GRE;
  }
  return local_9;
}

Assistant:

bool ExpressNode::isBinaryOperation() {
  return _operation == OperationType::PLUS ||
         _operation == OperationType::MINU ||
         _operation == OperationType::MUL || _operation == OperationType::DIV ||
         _operation == OperationType::MOD || _operation == OperationType::OR ||
         _operation == OperationType::AND || _operation == OperationType::EQL ||
         _operation == OperationType::NEQ || _operation == OperationType::LSS ||
         _operation == OperationType::LEQ || _operation == OperationType::GEQ ||
         _operation == OperationType::GRE;
}